

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall
icu_63::SimpleFormatter::applyPatternMinMaxArguments
          (SimpleFormatter *this,UnicodeString *pattern,int32_t min,int32_t max,
          UErrorCode *errorCode)

{
  int iVar1;
  UnicodeString *this_00;
  short sVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  char16_t *pcVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char16_t cVar12;
  uint uVar13;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  pcVar7 = UnicodeString::getBuffer(pattern);
  sVar2 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar10 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar10 = (int)sVar2 >> 5;
  }
  this_00 = &this->compiledPattern;
  UnicodeString::setTo(this_00,L'\0');
  iVar8 = -1;
  uVar13 = 0;
  iVar11 = 0;
LAB_00297ade:
  bVar3 = false;
  do {
    lVar9 = (long)iVar11;
    iVar4 = iVar11 + 3;
    bVar5 = bVar3;
    do {
      bVar3 = bVar5;
      iVar6 = iVar4;
      if (iVar10 <= (int)lVar9) {
        if (0 < (int)uVar13) {
          sVar2 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar10 = (this->compiledPattern).fUnion.fFields.fLength;
          }
          else {
            iVar10 = (int)sVar2 >> 5;
          }
          UnicodeString::setCharAt(this_00,iVar10 + ~uVar13,(short)uVar13 + L'Ā');
        }
        if (iVar8 < max && min <= iVar8 + 1) {
          UnicodeString::setCharAt(this_00,0,(UChar)(iVar8 + 1));
          return '\x01';
        }
        goto LAB_00297cf8;
      }
      iVar11 = iVar6 + -2;
      cVar12 = pcVar7[lVar9];
      if (cVar12 != L'\'') {
        if ((bVar3) || (cVar12 != L'{')) goto LAB_00297b6e;
        if (0 < (int)uVar13) {
          sVar2 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar11 = (this->compiledPattern).fUnion.fFields.fLength;
          }
          else {
            iVar11 = (int)sVar2 >> 5;
          }
          UnicodeString::setCharAt(this_00,iVar11 + ~uVar13,(short)uVar13 + L'Ā');
          uVar13 = 0;
        }
        iVar4 = iVar6 + -2;
        iVar1 = iVar6 + -1;
        iVar11 = iVar6;
        if (((iVar1 < iVar10) && (iVar6 = (ushort)pcVar7[iVar4] - 0x30, (ushort)iVar6 < 10)) &&
           (pcVar7[iVar1] == L'}')) goto LAB_00297c78;
        if ((iVar10 <= iVar4) || (8 < (ushort)(pcVar7[iVar4] + L'ￏ'))) goto LAB_00297cf8;
        lVar9 = (long)iVar1;
        iVar6 = (ushort)pcVar7[iVar4] - 0x30;
        goto LAB_00297c35;
      }
      cVar12 = L'\'';
      if ((iVar11 < iVar10) && (cVar12 = pcVar7[iVar11], cVar12 == L'\'')) {
        cVar12 = L'\'';
        goto LAB_00297b62;
      }
      lVar9 = lVar9 + 1;
      iVar4 = iVar6 + 1;
      bVar5 = false;
    } while (bVar3);
    if ((cVar12 == L'{') || (cVar12 == L'}')) {
      bVar3 = true;
LAB_00297b62:
      iVar11 = iVar6 + -1;
    }
    else {
      cVar12 = L'\'';
      bVar3 = false;
    }
LAB_00297b6e:
    if (uVar13 == 0) {
      UnicodeString::append(this_00,L'\xffff');
    }
    UnicodeString::append(this_00,cVar12);
    uVar13 = uVar13 + 1;
    if (uVar13 == 0xfeff) {
      uVar13 = 0;
    }
  } while( true );
LAB_00297c35:
  if (iVar10 <= lVar9) goto LAB_00297cf8;
  cVar12 = pcVar7[lVar9];
  if (9 < (ushort)(cVar12 + L'￐')) goto LAB_00297c66;
  iVar6 = iVar6 * 10 + (uint)(ushort)cVar12 + -0x30;
  iVar11 = iVar11 + 1;
  lVar9 = lVar9 + 1;
  if (0xff < iVar6) goto LAB_00297cf8;
  goto LAB_00297c35;
LAB_00297c66:
  if ((iVar6 < 0) || (cVar12 != L'}')) {
LAB_00297cf8:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return '\0';
  }
LAB_00297c78:
  if (iVar8 < iVar6) {
    iVar8 = iVar6;
  }
  UnicodeString::append(this_00,(char16_t)iVar6);
  goto LAB_00297ade;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }